

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  ulong *puVar1;
  Enum EVar2;
  int iVar3;
  Module *pMVar4;
  Memory *args;
  pointer ppGVar5;
  Global *args_00;
  Table *args_01;
  int *piVar6;
  Type t;
  pointer pTVar7;
  size_type sVar8;
  LoadStoreTracking *this_00;
  pointer ppFVar9;
  char cVar10;
  bool bVar11;
  long *plVar12;
  uint uVar13;
  Index IVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *args_1_00;
  ulong uVar15;
  string *args_1_01;
  Func *pFVar16;
  Func *pFVar17;
  Index IVar18;
  char cVar19;
  char (*args_2) [2];
  char (*in_R9) [4];
  char cVar20;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  pointer ppMVar22;
  pointer ppGVar23;
  pointer ppTVar24;
  _Alloc_hider _Var25;
  Decompiler *pDVar26;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string __str;
  string __str_1;
  string ds;
  char (*in_stack_fffffffffffffe58) [2];
  string local_1a0;
  char local_179;
  Decompiler *local_178;
  Func *local_170;
  Index local_164;
  string local_160;
  string local_140;
  LoadStoreTracking *local_120;
  pointer local_118;
  undefined1 local_110 [200];
  _Base_ptr local_48;
  Func **local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar4 = (this->mc).module;
  ppMVar22 = (pMVar4->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pFVar17 = (Func *)(pMVar4->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  local_178 = this;
  if ((Func *)ppMVar22 != pFVar17) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_170 = pFVar17;
    do {
      args = *ppMVar22;
      in_R9 = (char (*) [4])(args->name)._M_dataplus._M_p;
      IVar18 = (Index)args_1;
      name._M_str = (char *)in_R9;
      name._M_len = (args->name)._M_string_length;
      bVar11 = CheckImportExport(local_178,__return_storage_ptr__,Memory,IVar18,name);
      cat<char[8],std::__cxx11::string>
                ((string *)local_110,(wabt *)"memory ",(char (*) [8])args,args_1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (!bVar11) {
        uVar21 = (args->page_limits).initial;
        cVar20 = '\x01';
        cVar19 = '\x01';
        if (9 < uVar21) {
          uVar15 = uVar21;
          cVar10 = '\x04';
          do {
            cVar19 = cVar10;
            if (uVar15 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_0012e9f5;
            }
            if (uVar15 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_0012e9f5;
            }
            if (uVar15 < 10000) goto LAB_0012e9f5;
            bVar11 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar10 = cVar19 + '\x04';
          } while (bVar11);
          cVar19 = cVar19 + '\x01';
        }
LAB_0012e9f5:
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_1a0._M_dataplus._M_p,(uint)local_1a0._M_string_length,uVar21);
        uVar21 = (args->page_limits).max;
        if (9 < uVar21) {
          uVar15 = uVar21;
          cVar19 = '\x04';
          do {
            cVar20 = cVar19;
            if (uVar15 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_0012ea7c;
            }
            if (uVar15 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_0012ea7c;
            }
            if (uVar15 < 10000) goto LAB_0012ea7c;
            bVar11 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar19 = cVar20 + '\x04';
          } while (bVar11);
          cVar20 = cVar20 + '\x01';
        }
LAB_0012ea7c:
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_140,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,uVar21);
        in_R9 = (char (*) [4])0x1660d5;
        cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_110,(wabt *)"(initial: ",(char (*) [11])&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1660d5,
                   in_stack_fffffffffffffe58);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        pFVar17 = local_170;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(IVar18 + 1);
      ppMVar22 = ppMVar22 + 1;
    } while ((Func *)ppMVar22 != pFVar17);
  }
  pDVar26 = local_178;
  pMVar4 = (local_178->mc).module;
  if ((pMVar4->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar4->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar4 = (pDVar26->mc).module;
  ppGVar23 = (pMVar4->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar5 = (pMVar4->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar23 != ppGVar5) {
    IVar18 = 0;
    do {
      args_00 = *ppGVar23;
      in_R9 = (char (*) [4])(args_00->name)._M_dataplus._M_p;
      name_00._M_str = (char *)in_R9;
      name_00._M_len = (args_00->name)._M_string_length;
      bVar11 = CheckImportExport(local_178,__return_storage_ptr__,Global,IVar18,name_00);
      EVar2 = (args_00->type).enum_;
      local_1a0._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_1a0._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_1a0._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_1a0._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_1a0._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_1a0._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_0012ebf3_caseD_fffffff1:
        local_1a0._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_1a0._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_1a0._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_1a0._M_dataplus._M_p = "double";
        break;
      case F32:
        local_1a0._M_dataplus._M_p = "float";
        break;
      case I64:
        local_1a0._M_dataplus._M_p = "long";
        break;
      case I32:
        local_1a0._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_1a0._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_0012ebf3_caseD_fffffff1;
          local_1a0._M_dataplus._M_p = "func";
        }
      }
      args_1_00 = ":";
      cat<char[8],std::__cxx11::string,char[2],char_const*>
                ((string *)local_110,(wabt *)"global ",(char (*) [8])args_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_1a0,(char **)in_R9);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (!bVar11) {
        InitExp_abi_cxx11_(&local_1a0,local_178,&args_00->init_expr);
        cat<char[4],std::__cxx11::string>
                  ((string *)local_110,(wabt *)" = ",(char (*) [4])&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar18 = IVar18 + 1;
      ppGVar23 = ppGVar23 + 1;
    } while (ppGVar23 != ppGVar5);
  }
  pDVar26 = local_178;
  pMVar4 = (local_178->mc).module;
  if ((pMVar4->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar4->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar4 = (pDVar26->mc).module;
  ppTVar24 = (pMVar4->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_170 = (Func *)(pMVar4->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if ((Func *)ppTVar24 != local_170) {
    IVar18 = 0;
    do {
      args_01 = *ppTVar24;
      in_R9 = (char (*) [4])(args_01->name)._M_dataplus._M_p;
      name_01._M_str = (char *)in_R9;
      name_01._M_len = (args_01->name)._M_string_length;
      bVar11 = CheckImportExport(pDVar26,__return_storage_ptr__,Table,IVar18,name_01);
      EVar2 = (args_01->elem_type).enum_;
      local_1a0._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_1a0._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_1a0._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_1a0._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_1a0._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_1a0._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_0012ee1b_caseD_fffffff1:
        local_1a0._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_1a0._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_1a0._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_1a0._M_dataplus._M_p = "double";
        break;
      case F32:
        local_1a0._M_dataplus._M_p = "float";
        break;
      case I64:
        local_1a0._M_dataplus._M_p = "long";
        break;
      case I32:
        local_1a0._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_1a0._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_0012ee1b_caseD_fffffff1;
          local_1a0._M_dataplus._M_p = "func";
        }
      }
      cat<char[7],std::__cxx11::string,char[2],char_const*>
                ((string *)local_110,(wabt *)"table ",(char (*) [7])args_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_1a0,(char **)in_R9);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (!bVar11) {
        uVar21 = (args_01->elem_limits).initial;
        cVar20 = '\x01';
        cVar19 = '\x01';
        if (9 < uVar21) {
          uVar15 = uVar21;
          cVar10 = '\x04';
          do {
            cVar19 = cVar10;
            if (uVar15 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_0012ef76;
            }
            if (uVar15 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_0012ef76;
            }
            if (uVar15 < 10000) goto LAB_0012ef76;
            bVar11 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar10 = cVar19 + '\x04';
          } while (bVar11);
          cVar19 = cVar19 + '\x01';
        }
LAB_0012ef76:
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_1a0._M_dataplus._M_p,(uint)local_1a0._M_string_length,uVar21);
        uVar21 = (args_01->elem_limits).max;
        if (9 < uVar21) {
          uVar15 = uVar21;
          cVar19 = '\x04';
          do {
            cVar20 = cVar19;
            if (uVar15 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_0012effe;
            }
            if (uVar15 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_0012effe;
            }
            if (uVar15 < 10000) goto LAB_0012effe;
            bVar11 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar19 = cVar20 + '\x04';
          } while (bVar11);
          cVar20 = cVar20 + '\x01';
        }
LAB_0012effe:
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_140,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,uVar21);
        in_R9 = (char (*) [4])0x1660d5;
        cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_110,(wabt *)"(min: ",(char (*) [7])&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1660d5,
                   in_stack_fffffffffffffe58);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        pDVar26 = local_178;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar18 = IVar18 + 1;
      ppTVar24 = ppTVar24 + 1;
    } while ((Func *)ppTVar24 != local_170);
  }
  pMVar4 = (pDVar26->mc).module;
  args_1_01 = (string *)
              (pMVar4->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if (args_1_01 !=
      (string *)
      (pMVar4->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar4 = (pDVar26->mc).module;
  pFVar17 = (Func *)(pMVar4->data_segments).
                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  local_170 = (Func *)(pMVar4->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar17 != local_170) {
    do {
      piVar6 = (int *)(pFVar17->name)._M_dataplus._M_p;
      iVar3 = *piVar6;
      if (iVar3 == 1) {
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"(passive","");
      }
      else {
        InitExp_abi_cxx11_(&local_140,local_178,(ExprList *)(piVar6 + 0x1c));
        cat<char[10],std::__cxx11::string>
                  (&local_1a0,(wabt *)"(offset: ",(char (*) [10])&local_140,args_1_01);
      }
      args_1_01 = &local_1a0;
      cat<char[6],std::__cxx11::string,std::__cxx11::string,char[4]>
                ((string *)local_110,(wabt *)"data ",(char (*) [6])(piVar6 + 2),&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") =",in_R9);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((iVar3 != 1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2)) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      BinaryToString_abi_cxx11_
                ((string *)local_110,local_178,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(piVar6 + 0x22));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      pFVar17 = (Func *)&(pFVar17->name)._M_string_length;
    } while (pFVar17 != local_170);
  }
  pDVar26 = local_178;
  pMVar4 = (local_178->mc).module;
  if ((pMVar4->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar4->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar4 = (pDVar26->mc).module;
  local_118 = (pMVar4->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_38 = (pMVar4->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_118 != local_38) {
    local_40 = &pDVar26->cur_func;
    local_120 = &pDVar26->lst;
    local_48 = &(pDVar26->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header;
    IVar18 = 0;
    do {
      pFVar17 = *local_118;
      pDVar26->cur_func = pFVar17;
      args_2 = (char (*) [2])(pFVar17->name)._M_string_length;
      name_02._M_str = (pFVar17->name)._M_dataplus._M_p;
      name_02._M_len = (size_t)args_2;
      local_164 = IVar18;
      bVar11 = CheckImportExport(pDVar26,__return_storage_ptr__,First,IVar18,name_02);
      AST::AST((AST *)local_110,&pDVar26->mc,pFVar17);
      pDVar26->cur_ast = (AST *)local_110;
      local_179 = bVar11;
      if (!bVar11) {
        args_2 = (char (*) [2])0x1;
        AST::Construct((AST *)local_110,&pFVar17->exprs,
                       (Index)((ulong)((long)(pFVar17->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pFVar17->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),0,true)
        ;
        this_00 = local_120;
        LoadStoreTracking::Track(local_120,(Node *)local_110._8_8_);
        LoadStoreTracking::CheckLayouts(this_00);
      }
      cat<char[10],std::__cxx11::string,char[2]>
                (&local_1a0,(wabt *)"function ",(char (*) [10])pFVar17,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15ea63,
                 args_2);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      local_170 = pFVar17;
      if (((long)(pFVar17->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pFVar17->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
        uVar21 = 0;
        do {
          if (uVar21 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          t = (pFVar17->decl).sig.param_types.
              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start[uVar21];
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          local_160._M_string_length = 0;
          local_160.field_2._M_local_buf[0] = '\0';
          uVar15 = uVar21 & 0xffffffff;
          do {
            uVar13 = (uint)uVar15;
            std::__cxx11::string::push_back((char)&local_160);
            uVar15 = (ulong)((int)(uVar15 / 0x1a) - 1);
          } while (0x19 < uVar13);
          args_2 = (char (*) [2])0x1;
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,0x157f44);
          pDVar26 = local_178;
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          puVar1 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_1a0.field_2._M_allocated_capacity = *puVar1;
            local_1a0.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1a0.field_2._M_allocated_capacity = *puVar1;
            local_1a0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1a0._M_string_length = plVar12[1];
          *plVar12 = (long)puVar1;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          LocalDecl(&local_160,pDVar26,&local_1a0,t);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          pFVar17 = local_170;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < ((ulong)((long)(pFVar17->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pFVar17->decl).sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff)
                );
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pTVar7 = (pFVar17->decl).sig.result_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar16 = (Func *)((ulong)((long)(pFVar17->decl).sig.result_types.
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar7) >>
                        3);
      if ((int)pFVar16 != 0) {
        if ((int)pFVar16 == 1) {
          EVar2 = pTVar7->enum_;
          pFVar17 = (Func *)(ulong)(uint)(EVar2 + 0x11);
          if ((uint)(EVar2 + 0x11) < 0x19) {
            pFVar16 = (Func *)((long)&switchD_0012f631::switchdataD_0015dc08 +
                              (long)(int)(&switchD_0012f631::switchdataD_0015dc08)[(long)pFVar17]);
            local_160._M_dataplus._M_p = "byte";
            switch(pFVar17) {
            case (Func *)0x0:
              local_160._M_dataplus._M_p = "externref";
              break;
            case (Func *)0x1:
              local_160._M_dataplus._M_p = "funcref";
              break;
            default:
switchD_0012f631_caseD_fffffff1:
              local_160._M_dataplus._M_p = "ILLEGAL";
              break;
            case (Func *)0xa:
              local_160._M_dataplus._M_p = "short";
              break;
            case (Func *)0xb:
              break;
            case (Func *)0xc:
              local_160._M_dataplus._M_p = "simd";
              break;
            case (Func *)0xd:
              local_160._M_dataplus._M_p = "double";
              break;
            case (Func *)0xe:
              local_160._M_dataplus._M_p = "float";
              break;
            case (Func *)0xf:
              local_160._M_dataplus._M_p = "long";
              break;
            case (Func *)0x10:
              local_160._M_dataplus._M_p = "int";
              break;
            case (Func *)0x15:
              local_160._M_dataplus._M_p = "ubyte";
              break;
            case (Func *)0x17:
              local_160._M_dataplus._M_p = "ushort";
              break;
            case (Func *)0x18:
              local_160._M_dataplus._M_p = "uint";
            }
          }
          else {
            pFVar16 = pFVar17;
            if (EVar2 == Void) {
              local_160._M_dataplus._M_p = "void";
            }
            else {
              if (EVar2 != Func) goto switchD_0012f631_caseD_fffffff1;
              local_160._M_dataplus._M_p = "func";
            }
          }
          cat<char[2],char_const*>(&local_1a0,(wabt *)":",(char (*) [2])&local_160,(char **)pFVar16)
          ;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          pFVar16 = (Func *)0x7fffffff8;
          if (((long)(pFVar17->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pFVar17->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
            uVar21 = 0;
            do {
              if (uVar21 != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              EVar2 = (local_170->decl).sig.result_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar21].enum_;
              switch(EVar2) {
              case I8U:
                break;
              case I16U:
                break;
              case I32U:
                break;
              case ExternRef:
                break;
              case FuncRef:
                break;
              case 0xfffffff1:
              case 0xfffffff2:
              case 0xfffffff3:
              case FuncRef|I8U:
              case 0xfffffff5:
              case FuncRef|I16U:
              case FuncRef|I32U:
              case ~I32U:
              case Any:
              case ~I64:
              case ~F32:
              case ~F64:
              case ~I8:
switchD_0012f6b1_caseD_fffffff1:
                break;
              case I16:
                break;
              case I8:
                break;
              case V128:
                break;
              case F64:
                break;
              case F32:
                break;
              case I64:
                break;
              case I32:
                break;
              default:
                if ((EVar2 != Void) && (EVar2 != Func)) goto switchD_0012f6b1_caseD_fffffff1;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar21 = uVar21 + 1;
              pFVar16 = local_170;
            } while (uVar21 < ((ulong)((long)(local_170->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_170->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                              0xffffffff));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      ppFVar9 = local_118;
      IVar18 = local_164;
      cVar19 = '\x01';
      if (local_179 == '\0') {
        if (9 < local_164) {
          IVar14 = local_164;
          cVar20 = '\x04';
          do {
            cVar19 = cVar20;
            if (IVar14 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_0012f9a5;
            }
            if (IVar14 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_0012f9a5;
            }
            if (IVar14 < 10000) goto LAB_0012f9a5;
            bVar11 = 99999 < IVar14;
            IVar14 = IVar14 / 10000;
            cVar20 = cVar19 + '\x04';
          } while (bVar11);
          cVar19 = cVar19 + '\x01';
        }
LAB_0012f9a5:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,IVar18);
        cat<char[11],std::__cxx11::string,char[2]>
                  (&local_1a0,(wabt *)" { // func",(char (*) [11])&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15e0b9,
                   args_2);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        DecompileExpr((Value *)&local_1a0,pDVar26,(Node *)local_110._8_8_,(Node *)0x0);
        IndentValue(pDVar26,(Value *)&local_1a0,pDVar26->indent_amount,(string_view)ZEXT816(0));
        sVar8 = local_1a0._M_string_length;
        for (_Var25._M_p = local_1a0._M_dataplus._M_p; _Var25._M_p != (pointer)sVar8;
            _Var25._M_p = _Var25._M_p + 0x20) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)_Var25._M_p);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1a0);
        pDVar26 = local_178;
        IVar18 = local_164;
      }
      else {
        if (9 < local_164) {
          pFVar16 = (Func *)(ulong)local_164;
          cVar20 = '\x04';
          do {
            cVar19 = cVar20;
            uVar13 = (uint)pFVar16;
            if (uVar13 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_0012f915;
            }
            if (uVar13 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_0012f915;
            }
            if (uVar13 < 10000) goto LAB_0012f915;
            pFVar16 = (Func *)((ulong)pFVar16 / 10000);
            cVar20 = cVar19 + '\x04';
          } while (99999 < uVar13);
          cVar19 = cVar19 + '\x01';
        }
LAB_0012f915:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,IVar18);
        cat<char[10],std::__cxx11::string>
                  (&local_1a0,(wabt *)"; // func",(char (*) [10])&local_160,&pFVar16->name);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ModuleContext::EndFunc(&pDVar26->mc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)local_120,
                 (_Link_type)
                 (pDVar26->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      (pDVar26->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pDVar26->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_48;
      (pDVar26->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_48;
      (pDVar26->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      IVar18 = IVar18 + 1;
      *local_40 = (Func *)0x0;
      local_40[1] = (Func *)0x0;
      AST::~AST((AST *)local_110);
      local_118 = ppFVar9 + 1;
    } while (local_118 != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name,
               dat->kind != SegmentKind::Passive
                   ? cat("(offset: ", InitExp(dat->offset))
                   : "(passive",
               ") =");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      } else {
        s += " ";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), 0, true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += cat("; // func", std::to_string(func_index));
      } else {
        s += cat(" { // func", std::to_string(func_index), "\n");
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }